

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbopacking32.h
# Opt level: O2

void unpackforblock28(uint32_t base,uint8_t **pw,uint32_t **pout)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  uint32_t *puVar16;
  uint uVar17;
  
  puVar1 = (ulong *)*pw;
  uVar2 = *puVar1;
  uVar3 = puVar1[1];
  uVar4 = puVar1[2];
  uVar5 = puVar1[3];
  uVar6 = puVar1[4];
  uVar7 = puVar1[5];
  uVar8 = puVar1[6];
  uVar9 = puVar1[7];
  uVar10 = puVar1[8];
  uVar11 = puVar1[9];
  uVar12 = puVar1[10];
  uVar13 = puVar1[0xb];
  uVar14 = puVar1[0xc];
  uVar15 = puVar1[0xd];
  puVar16 = *pout;
  *pw = (uint8_t *)(puVar1 + 0xe);
  *puVar16 = ((uint)uVar2 & 0xfffffff) + base;
  puVar16[1] = ((uint)(uVar2 >> 0x1c) & 0xfffffff) + base;
  puVar16[2] = ((uint)(uVar3 << 8) & 0xfffffff | (uint)(byte)(uVar2 >> 0x38)) + base;
  puVar16[3] = ((uint)(uVar3 >> 0x14) & 0xfffffff) + base;
  puVar16[4] = ((uint)(uVar4 << 0x10) & 0xfffffff | (uint)(ushort)(uVar3 >> 0x30)) + base;
  puVar16[5] = ((uint)(uVar4 >> 0xc) & 0xfffffff) + base;
  puVar16[6] = ((uint)(uVar5 << 0x18) & 0xfffffff | (uint)(uVar4 >> 0x28)) + base;
  puVar16[7] = ((uint)(uVar5 >> 4) & 0xfffffff) + base;
  uVar17 = (uint)(uVar5 >> 0x20);
  puVar16[8] = (uVar17 & 0xfffffff) + base;
  puVar16[9] = ((uint)(uVar6 << 4) & 0xfffffff | uVar17 >> 0x1c) + base;
  puVar16[10] = ((uint)(uVar6 >> 0x18) & 0xfffffff) + base;
  puVar16[0xb] = ((uint)(uVar7 << 0xc) & 0xfffffff | (uint)(uVar6 >> 0x34)) + base;
  puVar16[0xc] = ((uint)(uVar7 >> 0x10) & 0xfffffff) + base;
  puVar16[0xd] = ((uint)(uVar8 << 0x14) & 0xfffffff | (uint)(uVar7 >> 0x2c)) + base;
  puVar16[0xe] = ((uint)(uVar8 >> 8) & 0xfffffff) + base;
  puVar16[0xf] = (uint)(uVar8 >> 0x24) + base;
  puVar16[0x10] = ((uint)uVar9 & 0xfffffff) + base;
  puVar16[0x11] = ((uint)(uVar9 >> 0x1c) & 0xfffffff) + base;
  puVar16[0x12] = ((uint)(uVar10 << 8) & 0xfffffff | (uint)(byte)(uVar9 >> 0x38)) + base;
  puVar16[0x13] = ((uint)(uVar10 >> 0x14) & 0xfffffff) + base;
  puVar16[0x14] = ((uint)(uVar11 << 0x10) & 0xfffffff | (uint)(ushort)(uVar10 >> 0x30)) + base;
  puVar16[0x15] = ((uint)(uVar11 >> 0xc) & 0xfffffff) + base;
  puVar16[0x16] = ((uint)(uVar12 << 0x18) & 0xfffffff | (uint)(uVar11 >> 0x28)) + base;
  puVar16[0x17] = ((uint)(uVar12 >> 4) & 0xfffffff) + base;
  uVar17 = (uint)(uVar12 >> 0x20);
  puVar16[0x18] = (uVar17 & 0xfffffff) + base;
  puVar16[0x19] = ((uint)(uVar13 << 4) & 0xfffffff | uVar17 >> 0x1c) + base;
  puVar16[0x1a] = ((uint)(uVar13 >> 0x18) & 0xfffffff) + base;
  puVar16[0x1b] = ((uint)(uVar14 << 0xc) & 0xfffffff | (uint)(uVar13 >> 0x34)) + base;
  puVar16[0x1c] = ((uint)(uVar14 >> 0x10) & 0xfffffff) + base;
  puVar16[0x1d] = ((uint)(uVar15 << 0x14) & 0xfffffff | (uint)(uVar14 >> 0x2c)) + base;
  puVar16[0x1e] = ((uint)(uVar15 >> 8) & 0xfffffff) + base;
  puVar16[0x1f] = (uint)(uVar15 >> 0x24) + base;
  *pout = *pout + 0x20;
  return;
}

Assistant:

static void unpackforblock28(const uint32_t base, const uint8_t **pw,
                             uint32_t **pout) {
  const uint64_t *pw64 = *(const uint64_t **)pw;
  uint32_t *out = *pout;
  const uint64_t mask = UINT64_C(268435455);
  /* we are going to access  14 64-bit words */
  uint64_t w0 = pw64[0];
  uint64_t w1 = pw64[1];
  uint64_t w2 = pw64[2];
  uint64_t w3 = pw64[3];
  uint64_t w4 = pw64[4];
  uint64_t w5 = pw64[5];
  uint64_t w6 = pw64[6];
  uint64_t w7 = pw64[7];
  uint64_t w8 = pw64[8];
  uint64_t w9 = pw64[9];
  uint64_t w10 = pw64[10];
  uint64_t w11 = pw64[11];
  uint64_t w12 = pw64[12];
  uint64_t w13 = pw64[13];
  *pw += 112; /* we used up 112 input bytes */
  out[0] = base + (uint32_t)((w0)&mask);
  out[1] = base + (uint32_t)((w0 >> 28) & mask);
  out[2] = base + (uint32_t)(((w0 >> 56) | (w1 << 8)) & mask);
  out[3] = base + (uint32_t)((w1 >> 20) & mask);
  out[4] = base + (uint32_t)(((w1 >> 48) | (w2 << 16)) & mask);
  out[5] = base + (uint32_t)((w2 >> 12) & mask);
  out[6] = base + (uint32_t)(((w2 >> 40) | (w3 << 24)) & mask);
  out[7] = base + (uint32_t)((w3 >> 4) & mask);
  out[8] = base + (uint32_t)((w3 >> 32) & mask);
  out[9] = base + (uint32_t)(((w3 >> 60) | (w4 << 4)) & mask);
  out[10] = base + (uint32_t)((w4 >> 24) & mask);
  out[11] = base + (uint32_t)(((w4 >> 52) | (w5 << 12)) & mask);
  out[12] = base + (uint32_t)((w5 >> 16) & mask);
  out[13] = base + (uint32_t)(((w5 >> 44) | (w6 << 20)) & mask);
  out[14] = base + (uint32_t)((w6 >> 8) & mask);
  out[15] = base + (uint32_t)(w6 >> 36);
  out[16] = base + (uint32_t)((w7)&mask);
  out[17] = base + (uint32_t)((w7 >> 28) & mask);
  out[18] = base + (uint32_t)(((w7 >> 56) | (w8 << 8)) & mask);
  out[19] = base + (uint32_t)((w8 >> 20) & mask);
  out[20] = base + (uint32_t)(((w8 >> 48) | (w9 << 16)) & mask);
  out[21] = base + (uint32_t)((w9 >> 12) & mask);
  out[22] = base + (uint32_t)(((w9 >> 40) | (w10 << 24)) & mask);
  out[23] = base + (uint32_t)((w10 >> 4) & mask);
  out[24] = base + (uint32_t)((w10 >> 32) & mask);
  out[25] = base + (uint32_t)(((w10 >> 60) | (w11 << 4)) & mask);
  out[26] = base + (uint32_t)((w11 >> 24) & mask);
  out[27] = base + (uint32_t)(((w11 >> 52) | (w12 << 12)) & mask);
  out[28] = base + (uint32_t)((w12 >> 16) & mask);
  out[29] = base + (uint32_t)(((w12 >> 44) | (w13 << 20)) & mask);
  out[30] = base + (uint32_t)((w13 >> 8) & mask);
  out[31] = base + (uint32_t)(w13 >> 36);
  *pout += 32; /* we wrote 32 32-bit integers */
}